

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get<tinyusdz::value::texcoord2f>
          (Attribute *this,double t,texcoord2f *dst,TimeSampleInterpolationType tinterp)

{
  float fVar1;
  bool bVar2;
  value_type *pvVar3;
  optional<tinyusdz::value::texcoord2f> local_50;
  undefined1 local_44 [8];
  optional<tinyusdz::value::texcoord2f> v;
  TimeSampleInterpolationType tinterp_local;
  texcoord2f *dst_local;
  double t_local;
  Attribute *this_local;
  
  if (dst == (texcoord2f *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    tinyusdz::value::TimeCode::TimeCode((TimeCode *)&v.contained,t);
    bVar2 = tinyusdz::value::TimeCode::is_default((TimeCode *)&v.contained);
    if ((bVar2) && (bVar2 = has_value(this), bVar2)) {
      primvar::PrimVar::get_value<tinyusdz::value::texcoord2f>(&local_50,&this->_var);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::
      optional<tinyusdz::value::texcoord2f,_0>
                ((optional<tinyusdz::value::texcoord2f> *)local_44,&local_50);
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::~optional(&local_50);
      bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_44);
      if (bVar2) {
        pvVar3 = nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::value
                           ((optional<tinyusdz::value::texcoord2f> *)local_44);
        fVar1 = pvVar3->t;
        dst->s = pvVar3->s;
        dst->t = fVar1;
        this_local._7_1_ = 1;
      }
      nonstd::optional_lite::optional<tinyusdz::value::texcoord2f>::~optional
                ((optional<tinyusdz::value::texcoord2f> *)local_44);
      if (bVar2) goto LAB_002f5488;
    }
    bVar2 = has_timesamples(this);
    if (bVar2) {
      this_local._7_1_ =
           primvar::PrimVar::get_interpolated_value<tinyusdz::value::texcoord2f>
                     (&this->_var,t,tinterp,dst);
    }
    else {
      this_local._7_1_ = get_value<tinyusdz::value::texcoord2f>(this,dst);
    }
  }
LAB_002f5488:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get(const double t, T *dst,
           value::TimeSampleInterpolationType tinterp =
           value::TimeSampleInterpolationType::Linear) const {
    if (!dst) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        nonstd::optional<T> v = _var.get_value<T>();
        if (v) {
          (*dst) = v.value();
          return true;
        }
      }
    }

    if (has_timesamples()) {
      return _var.get_interpolated_value(t, tinterp, dst);
    }

    // try to get 'defaut' value
    return get_value(dst);
  }